

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O2

void __thiscall
TTD::SnapshotExtractor::ExtractScriptFunctionEnvironmentIfNeeded
          (SnapshotExtractor *this,ScriptFunction *function)

{
  FrameDisplay *environment;
  
  environment = (function->environment).ptr;
  if (environment->length != 0) {
    ExtractScopeIfNeeded
              (this,(((((function->super_ScriptFunctionBase).super_JavascriptFunction.
                        super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
                     )->super_JavascriptLibraryBase).scriptContext.ptr,environment);
    return;
  }
  return;
}

Assistant:

void SnapshotExtractor::ExtractScriptFunctionEnvironmentIfNeeded(Js::ScriptFunction* function)
    {
        Js::FrameDisplay* environment = function->GetEnvironment();
        if(environment->GetLength() != 0)
        {
            this->ExtractScopeIfNeeded(function->GetScriptContext(), environment);
        }
    }